

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeJD(DateTime *p)

{
  ushort uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (p->validJD != '\0') {
    return;
  }
  if (p->validYMD == '\0') {
    iVar5 = 2000;
    iVar4 = 1;
    iVar2 = 1;
  }
  else {
    iVar5 = p->Y;
    if (iVar5 - 10000U < 0xffffc687) goto LAB_001a0a14;
    iVar2 = p->M;
    iVar4 = p->D;
  }
  if ((p->field_0x2c & 1) == 0) {
    iVar6 = iVar2 + 0xc;
    if (2 < iVar2) {
      iVar6 = iVar2;
    }
    iVar5 = iVar5 - (uint)(iVar2 < 3);
    uVar1 = (short)iVar5 + 0x12c0;
    lVar3 = (long)(((double)(int)(((iVar4 + (iVar6 * 0x4ab51 + 0x4ab51) / 10000 +
                                   (iVar5 * 0x8ead + 0xa445afcU) / 100) - uVar1 / 100) + uVar1 / 400
                                 + 0x26) + -1524.5) * 86400000.0);
    p->iJD = lVar3;
    p->validJD = '\x01';
    if (p->validHMS != '\0') {
      lVar3 = (long)(p->s * 1000.0 + 0.5) + (long)p->m * 60000 + (long)p->h * 3600000 + lVar3;
      p->iJD = lVar3;
      if ((long)p->tz != 0) {
        p->iJD = lVar3 + (long)p->tz * -60000;
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->tz = 0;
        p->field_0x2c = p->field_0x2c & 0xe6 | 8;
      }
    }
    return;
  }
LAB_001a0a14:
  p->s = 0.0;
  p->validJD = '\0';
  p->validYMD = '\0';
  p->validHMS = '\0';
  p->nFloor = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->D = 0;
  p->h = 0;
  p->m = 0;
  p->tz = 0;
  p->iJD = 0;
  p->Y = 0;
  p->M = 0;
  p->field_0x2c = p->field_0x2c | 2;
  return;
}

Assistant:

static void computeJD(DateTime *p){
  int Y, M, D, A, B, X1, X2;

  if( p->validJD ) return;
  if( p->validYMD ){
    Y = p->Y;
    M = p->M;
    D = p->D;
  }else{
    Y = 2000;  /* If no YMD specified, assume 2000-Jan-01 */
    M = 1;
    D = 1;
  }
  if( Y<-4713 || Y>9999 || p->rawS ){
    datetimeError(p);
    return;
  }
  if( M<=2 ){
    Y--;
    M += 12;
  }
  A = (Y+4800)/100;
  B = 38 - A + (A/4);
  X1 = 36525*(Y+4716)/100;
  X2 = 306001*(M+1)/10000;
  p->iJD = (sqlite3_int64)((X1 + X2 + D + B - 1524.5 ) * 86400000);
  p->validJD = 1;
  if( p->validHMS ){
    p->iJD += p->h*3600000 + p->m*60000 + (sqlite3_int64)(p->s*1000 + 0.5);
    if( p->tz ){
      p->iJD -= p->tz*60000;
      p->validYMD = 0;
      p->validHMS = 0;
      p->tz = 0;
      p->isUtc = 1;
      p->isLocal = 0;
    }
  }
}